

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O0

uv_loop_t * uv_loop_new(void)

{
  int iVar1;
  uv_loop_t *__ptr;
  uv_loop_t *loop;
  uv_loop_t *in_stack_fffffffffffffff8;
  
  __ptr = (uv_loop_t *)malloc(0x2d0);
  if (__ptr == (uv_loop_t *)0x0) {
    __ptr = (uv_loop_t *)0x0;
  }
  else {
    iVar1 = uv__loop_init(in_stack_fffffffffffffff8,(int)((ulong)__ptr >> 0x20));
    if (iVar1 != 0) {
      free(__ptr);
      __ptr = (uv_loop_t *)0x0;
    }
  }
  return __ptr;
}

Assistant:

uv_loop_t* uv_loop_new(void) {
  uv_loop_t* loop;

  loop = malloc(sizeof(*loop));
  if (loop == NULL)
    return NULL;

  if (uv__loop_init(loop, /* default_loop? */ 0)) {
    free(loop);
    return NULL;
  }

  return loop;
}